

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPL3.cpp
# Opt level: O3

double __thiscall PhaseGenerator::getPhase(PhaseGenerator *this,OPL3 *OPL3,int vib)

{
  double dVar1;
  
  dVar1 = this->phaseIncrement;
  if (vib == 1) {
    dVar1 = dVar1 * ::OPL3::OPL3Data->vibratoTable[OPL3->dvb][OPL3->vibratoIndex];
  }
  dVar1 = dVar1 + this->phase;
  this->phase = dVar1;
  return dVar1;
}

Assistant:

double PhaseGenerator::getPhase(OPL3 *OPL3, int vib) {
	if(vib==1) 
		// phaseIncrement = (operatorFrequency * vibrato) / OPL_SAMPLE_RATE
		phase += phaseIncrement*OPL3::OPL3Data->vibratoTable[OPL3->dvb][OPL3->vibratoIndex];
	else 
		// phaseIncrement = operatorFrequency / OPL_SAMPLE_RATE
		phase += phaseIncrement;
	// Originally clamped phase to [0,1), but that's not needed
	return phase;
}